

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeExtractValues.cpp
# Opt level: O0

void __thiscall BatchResultValues::add(BatchResultValues *this,CaseValues *result)

{
  CaseValues *this_00;
  CaseValues *local_20;
  CaseValues *copy;
  CaseValues *result_local;
  BatchResultValues *this_local;
  
  copy = result;
  result_local = (CaseValues *)this;
  this_00 = (CaseValues *)operator_new(0x60);
  CaseValues::CaseValues(this_00,copy);
  local_20 = this_00;
  std::vector<CaseValues_*,_std::allocator<CaseValues_*>_>::push_back(&this->m_caseValues,&local_20)
  ;
  return;
}

Assistant:

void add (const CaseValues& result)
	{
		CaseValues* copy = new CaseValues(result);
		try
		{
			m_caseValues.push_back(copy);
		}
		catch (...)
		{
			delete copy;
			throw;
		}
	}